

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * ghc::filesystem::proximate(path *__return_storage_ptr__,path *p,path *base,error_code *ec)

{
  path pStack_68;
  path local_48;
  
  weakly_canonical(&local_48,p,ec);
  weakly_canonical(&pStack_68,base,ec);
  path::lexically_proximate(__return_storage_ptr__,&local_48,&pStack_68);
  std::__cxx11::string::~string((string *)&pStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path proximate(const path& p, const path& base, std::error_code& ec)
{
    return weakly_canonical(p, ec).lexically_proximate(weakly_canonical(base, ec));
}